

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerMSL::add_argument_buffer_padding_type
          (CompilerMSL *this,uint32_t mbr_type_id,SPIRType *struct_type,uint32_t *mbr_idx,
          uint32_t *arg_buff_index,uint32_t count)

{
  TypeID id;
  uint32_t index;
  SPIRType *this_00;
  SPIRType *pSVar1;
  uint32_t local_60;
  uint32_t count_local;
  char (*local_58) [3];
  string local_50;
  
  local_60 = mbr_type_id;
  count_local = count;
  if (1 < count) {
    local_58 = (char (*) [3])arg_buff_index;
    local_60 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
    this_00 = Compiler::set<spirv_cross::SPIRType>((Compiler *)this,local_60);
    pSVar1 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,mbr_type_id);
    SPIRType::operator=(this_00,pSVar1);
    SmallVector<unsigned_int,_8UL>::push_back(&this_00->array,&count_local);
    local_50._M_dataplus._M_p._0_4_ = CONCAT31(local_50._M_dataplus._M_p._1_3_,1);
    SmallVector<bool,_8UL>::push_back(&this_00->array_size_literal,(bool *)&local_50);
    (this_00->parent_type).id = mbr_type_id;
    arg_buff_index = (uint32_t *)local_58;
  }
  id.id = (struct_type->super_IVariant).self.id;
  index = *mbr_idx;
  join<char_const(&)[3],unsigned_int&,char_const(&)[5]>
            (&local_50,(spirv_cross *)0x3935de,(char (*) [3])arg_buff_index,(uint *)"_pad",
             (char (*) [5])arg_buff_index);
  Compiler::set_member_name((Compiler *)this,id,index,&local_50);
  ::std::__cxx11::string::~string((string *)&local_50);
  Compiler::set_extended_member_decoration
            ((Compiler *)this,(struct_type->super_IVariant).self.id,*mbr_idx,
             SPIRVCrossDecorationResourceIndexPrimary,*arg_buff_index);
  local_50._M_dataplus._M_p._0_4_ = local_60;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
            (&struct_type->member_types,(TypedID<(spirv_cross::Types)1> *)&local_50);
  *arg_buff_index = *arg_buff_index + count_local;
  *mbr_idx = *mbr_idx + 1;
  return;
}

Assistant:

void CompilerMSL::add_argument_buffer_padding_type(uint32_t mbr_type_id, SPIRType &struct_type, uint32_t &mbr_idx,
                                                   uint32_t &arg_buff_index, uint32_t count)
{
	uint32_t type_id = mbr_type_id;
	if (count > 1)
	{
		uint32_t ary_type_id = ir.increase_bound_by(1);
		auto &ary_type = set<SPIRType>(ary_type_id);
		ary_type = get<SPIRType>(type_id);
		ary_type.array.push_back(count);
		ary_type.array_size_literal.push_back(true);
		ary_type.parent_type = type_id;
		type_id = ary_type_id;
	}

	set_member_name(struct_type.self, mbr_idx, join("_m", arg_buff_index, "_pad"));
	set_extended_member_decoration(struct_type.self, mbr_idx, SPIRVCrossDecorationResourceIndexPrimary, arg_buff_index);
	struct_type.member_types.push_back(type_id);

	arg_buff_index += count;
	mbr_idx++;
}